

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::SubdivPatch1MBIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  GridSOA *pGVar3;
  GridSOA *pGVar4;
  float *pfVar5;
  GridSOA *pGVar6;
  float *pfVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  GridSOA *pGVar12;
  size_t sVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar23;
  long lVar24;
  long lVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  RTCRayN *pRVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  GridSOA *pGVar31;
  undefined4 uVar32;
  ulong uVar33;
  ulong uVar34;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar35;
  GridSOA *pGVar36;
  long lVar37;
  ulong uVar38;
  GridSOA *pGVar39;
  GridSOA *pGVar40;
  GridSOA *pGVar41;
  GridSOA *pGVar42;
  GridSOA *pGVar43;
  Geometry *pGVar44;
  ulong uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar82;
  float fVar84;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar83;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar79;
  undefined1 auVar80 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar81;
  float fVar88;
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  float fVar105;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  uint uVar89;
  uint uVar106;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar107;
  undefined1 auVar108 [12];
  undefined1 auVar109 [12];
  float fVar117;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  uint uVar118;
  uint uVar119;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar120;
  float fVar135;
  float fVar136;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar123;
  float fVar137;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar138;
  float fVar143;
  float fVar144;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar145;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar150;
  float fVar151;
  float fVar152;
  float fVar157;
  float fVar158;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar159;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar160;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar187;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar194;
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar196 [16];
  float fVar203;
  float fVar204;
  float fVar210;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float old_t;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  vbool<4> valid;
  undefined1 local_1258 [16];
  Precalculations *local_1248;
  GridSOA *local_1240;
  ulong local_1238;
  ulong local_1230;
  undefined8 local_1228;
  float fStack_1220;
  float fStack_121c;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_1158 [4];
  float local_1148 [4];
  undefined1 local_1138 [8];
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  undefined8 local_10e8;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined4 local_10a8;
  undefined4 uStack_10a4;
  undefined4 uStack_10a0;
  undefined4 uStack_109c;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined1 local_1068 [16];
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar127 [16];
  undefined1 auVar131 [16];
  undefined1 auVar205 [16];
  
  pSVar35 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_fb8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_fc8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_fd8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fe8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_ff8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1008 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar29 = (tray->tnear).field_0.i[k];
  local_1018._4_4_ = iVar29;
  local_1018._0_4_ = iVar29;
  local_1018._8_4_ = iVar29;
  local_1018._12_4_ = iVar29;
  iVar29 = (tray->tfar).field_0.i[k];
  auVar167._4_4_ = iVar29;
  auVar167._0_4_ = iVar29;
  auVar167._8_4_ = iVar29;
  auVar167._12_4_ = iVar29;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fVar50 = local_fc8;
  fVar211 = local_fc8;
  fVar152 = local_fc8;
  fVar52 = local_fc8;
  fVar83 = local_fd8;
  fVar85 = local_fd8;
  fVar87 = local_fd8;
  fVar107 = local_fd8;
  auVar92 = local_1018;
  fVar117 = local_fb8;
  fVar138 = local_fb8;
  fVar143 = local_fb8;
  fVar144 = local_fb8;
  fVar145 = local_fe8;
  fVar151 = local_fe8;
  fVar120 = local_fe8;
  fVar157 = local_fe8;
  fVar135 = local_ff8;
  fVar158 = local_ff8;
  fVar136 = local_ff8;
  fVar159 = local_ff8;
  fVar137 = local_1008;
  fVar187 = local_1008;
  fVar192 = local_1008;
  fVar165 = local_1008;
  local_1248 = pre;
LAB_0072c12d:
  do {
    do {
      if (pSVar35 == stack) {
        return;
      }
      pSVar23 = pSVar35 + -1;
      pSVar35 = pSVar35 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar23->dist &&
             (float)pSVar23->dist != *(float *)(ray + k * 4 + 0x80));
    uVar30 = (pSVar35->ptr).ptr;
    while ((uVar30 & 8) == 0) {
      uVar26 = uVar30 & 0xfffffffffffffff0;
      fVar195 = *(float *)(ray + k * 4 + 0x70);
      pfVar7 = (float *)(uVar26 + 0x80 + uVar38);
      pfVar5 = (float *)(uVar26 + 0x20 + uVar38);
      auVar110._0_4_ = ((*pfVar7 * fVar195 + *pfVar5) - fVar117) * fVar145;
      auVar110._4_4_ = ((pfVar7[1] * fVar195 + pfVar5[1]) - fVar138) * fVar151;
      auVar110._8_4_ = ((pfVar7[2] * fVar195 + pfVar5[2]) - fVar143) * fVar120;
      auVar110._12_4_ = ((pfVar7[3] * fVar195 + pfVar5[3]) - fVar144) * fVar157;
      auVar110 = maxps(auVar92,auVar110);
      pfVar7 = (float *)(uVar26 + 0x80 + uVar34);
      pfVar5 = (float *)(uVar26 + 0x20 + uVar34);
      auVar121._0_4_ = ((*pfVar7 * fVar195 + *pfVar5) - fVar50) * fVar135;
      auVar121._4_4_ = ((pfVar7[1] * fVar195 + pfVar5[1]) - fVar211) * fVar158;
      auVar121._8_4_ = ((pfVar7[2] * fVar195 + pfVar5[2]) - fVar152) * fVar136;
      auVar121._12_4_ = ((pfVar7[3] * fVar195 + pfVar5[3]) - fVar52) * fVar159;
      pfVar7 = (float *)(uVar26 + 0x80 + uVar45);
      pfVar5 = (float *)(uVar26 + 0x20 + uVar45);
      auVar148._0_4_ = ((*pfVar7 * fVar195 + *pfVar5) - fVar83) * fVar137;
      auVar148._4_4_ = ((pfVar7[1] * fVar195 + pfVar5[1]) - fVar85) * fVar187;
      auVar148._8_4_ = ((pfVar7[2] * fVar195 + pfVar5[2]) - fVar87) * fVar192;
      auVar148._12_4_ = ((pfVar7[3] * fVar195 + pfVar5[3]) - fVar107) * fVar165;
      auVar121 = maxps(auVar121,auVar148);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar110,auVar121);
      pfVar7 = (float *)(uVar26 + 0x80 + (uVar38 ^ 0x10));
      pfVar5 = (float *)(uVar26 + 0x20 + (uVar38 ^ 0x10));
      auVar149._0_4_ = ((*pfVar7 * fVar195 + *pfVar5) - fVar117) * fVar145;
      auVar149._4_4_ = ((pfVar7[1] * fVar195 + pfVar5[1]) - fVar138) * fVar151;
      auVar149._8_4_ = ((pfVar7[2] * fVar195 + pfVar5[2]) - fVar143) * fVar120;
      auVar149._12_4_ = ((pfVar7[3] * fVar195 + pfVar5[3]) - fVar144) * fVar157;
      auVar110 = minps(auVar167,auVar149);
      pfVar7 = (float *)(uVar26 + 0x80 + (uVar34 ^ 0x10));
      pfVar5 = (float *)(uVar26 + 0x20 + (uVar34 ^ 0x10));
      auVar154._0_4_ = ((*pfVar7 * fVar195 + *pfVar5) - fVar50) * fVar135;
      auVar154._4_4_ = ((pfVar7[1] * fVar195 + pfVar5[1]) - fVar211) * fVar158;
      auVar154._8_4_ = ((pfVar7[2] * fVar195 + pfVar5[2]) - fVar152) * fVar136;
      auVar154._12_4_ = ((pfVar7[3] * fVar195 + pfVar5[3]) - fVar52) * fVar159;
      pfVar7 = (float *)(uVar26 + 0x80 + (uVar45 ^ 0x10));
      pfVar5 = (float *)(uVar26 + 0x20 + (uVar45 ^ 0x10));
      auVar146._0_4_ = ((*pfVar7 * fVar195 + *pfVar5) - fVar83) * fVar137;
      auVar146._4_4_ = ((pfVar7[1] * fVar195 + pfVar5[1]) - fVar85) * fVar187;
      auVar146._8_4_ = ((pfVar7[2] * fVar195 + pfVar5[2]) - fVar87) * fVar192;
      auVar146._12_4_ = ((pfVar7[3] * fVar195 + pfVar5[3]) - fVar107) * fVar165;
      auVar121 = minps(auVar154,auVar146);
      auVar110 = minps(auVar110,auVar121);
      uVar28 = (uint)uVar30 & 7;
      if (uVar28 == 6) {
        bVar14 = (fVar195 < *(float *)(uVar26 + 0xf0) && *(float *)(uVar26 + 0xe0) <= fVar195) &&
                 tNear.field_0._0_4_ <= auVar110._0_4_;
        bVar15 = (fVar195 < *(float *)(uVar26 + 0xf4) && *(float *)(uVar26 + 0xe4) <= fVar195) &&
                 tNear.field_0._4_4_ <= auVar110._4_4_;
        bVar16 = (fVar195 < *(float *)(uVar26 + 0xf8) && *(float *)(uVar26 + 0xe8) <= fVar195) &&
                 tNear.field_0._8_4_ <= auVar110._8_4_;
        bVar17 = (fVar195 < *(float *)(uVar26 + 0xfc) && *(float *)(uVar26 + 0xec) <= fVar195) &&
                 tNear.field_0._12_4_ <= auVar110._12_4_;
      }
      else {
        bVar14 = tNear.field_0._0_4_ <= auVar110._0_4_;
        bVar15 = tNear.field_0._4_4_ <= auVar110._4_4_;
        bVar16 = tNear.field_0._8_4_ <= auVar110._8_4_;
        bVar17 = tNear.field_0._12_4_ <= auVar110._12_4_;
      }
      auVar53._0_4_ = (uint)bVar14 * -0x80000000;
      auVar53._4_4_ = (uint)bVar15 * -0x80000000;
      auVar53._8_4_ = (uint)bVar16 * -0x80000000;
      auVar53._12_4_ = (uint)bVar17 * -0x80000000;
      uVar28 = movmskps(uVar28,auVar53);
      if (uVar28 == 0) goto LAB_0072c12d;
      uVar28 = uVar28 & 0xff;
      lVar37 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
        }
      }
      uVar30 = *(ulong *)(uVar26 + lVar37 * 8);
      uVar28 = uVar28 - 1 & uVar28;
      if (uVar28 != 0) {
        uVar89 = tNear.field_0.i[lVar37];
        lVar37 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
          }
        }
        uVar33 = *(ulong *)(uVar26 + lVar37 * 8);
        uVar106 = tNear.field_0.i[lVar37];
        uVar28 = uVar28 - 1 & uVar28;
        if (uVar28 == 0) {
          if (uVar89 < uVar106) {
            (pSVar35->ptr).ptr = uVar33;
            pSVar35->dist = uVar106;
            pSVar35 = pSVar35 + 1;
          }
          else {
            (pSVar35->ptr).ptr = uVar30;
            pSVar35->dist = uVar89;
            uVar30 = uVar33;
            pSVar35 = pSVar35 + 1;
          }
        }
        else {
          auVar111._8_4_ = uVar89;
          auVar111._0_8_ = uVar30;
          auVar111._12_4_ = 0;
          auVar139._8_4_ = uVar106;
          auVar139._0_8_ = uVar33;
          auVar139._12_4_ = 0;
          lVar37 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
            }
          }
          uVar11 = *(undefined8 *)(uVar26 + lVar37 * 8);
          iVar29 = tNear.field_0.i[lVar37];
          auVar122._8_4_ = iVar29;
          auVar122._0_8_ = uVar11;
          auVar122._12_4_ = 0;
          auVar54._8_4_ = -(uint)((int)uVar89 < (int)uVar106);
          uVar28 = uVar28 - 1 & uVar28;
          if (uVar28 == 0) {
            auVar54._4_4_ = auVar54._8_4_;
            auVar54._0_4_ = auVar54._8_4_;
            auVar54._12_4_ = auVar54._8_4_;
            auVar147._8_4_ = uVar106;
            auVar147._0_8_ = uVar33;
            auVar147._12_4_ = 0;
            auVar148 = blendvps(auVar147,auVar111,auVar54);
            auVar110 = blendvps(auVar111,auVar139,auVar54);
            auVar55._8_4_ = -(uint)(auVar148._8_4_ < iVar29);
            auVar55._4_4_ = auVar55._8_4_;
            auVar55._0_4_ = auVar55._8_4_;
            auVar55._12_4_ = auVar55._8_4_;
            auVar140._8_4_ = iVar29;
            auVar140._0_8_ = uVar11;
            auVar140._12_4_ = 0;
            auVar121 = blendvps(auVar140,auVar148,auVar55);
            auVar148 = blendvps(auVar148,auVar122,auVar55);
            auVar56._8_4_ = -(uint)(auVar110._8_4_ < auVar148._8_4_);
            auVar56._4_4_ = auVar56._8_4_;
            auVar56._0_4_ = auVar56._8_4_;
            auVar56._12_4_ = auVar56._8_4_;
            SVar123 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar148,auVar110,auVar56);
            SVar112 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar110,auVar148,auVar56);
            *pSVar35 = SVar112;
            pSVar35[1] = SVar123;
            uVar30 = auVar121._0_8_;
            pSVar35 = pSVar35 + 2;
          }
          else {
            lVar37 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            auVar57._4_4_ = auVar54._8_4_;
            auVar57._0_4_ = auVar54._8_4_;
            auVar57._8_4_ = auVar54._8_4_;
            auVar57._12_4_ = auVar54._8_4_;
            auVar149 = blendvps(auVar139,auVar111,auVar57);
            auVar110 = blendvps(auVar111,auVar139,auVar57);
            auVar153._8_4_ = tNear.field_0.i[lVar37];
            auVar153._0_8_ = *(undefined8 *)(uVar26 + lVar37 * 8);
            auVar153._12_4_ = 0;
            auVar58._8_4_ = -(uint)(iVar29 < tNear.field_0.i[lVar37]);
            auVar58._4_4_ = auVar58._8_4_;
            auVar58._0_4_ = auVar58._8_4_;
            auVar58._12_4_ = auVar58._8_4_;
            auVar148 = blendvps(auVar153,auVar122,auVar58);
            auVar121 = blendvps(auVar122,auVar153,auVar58);
            auVar59._8_4_ = -(uint)(auVar110._8_4_ < auVar121._8_4_);
            auVar59._4_4_ = auVar59._8_4_;
            auVar59._0_4_ = auVar59._8_4_;
            auVar59._12_4_ = auVar59._8_4_;
            auVar154 = blendvps(auVar121,auVar110,auVar59);
            SVar112 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar110,auVar121,auVar59);
            auVar60._8_4_ = -(uint)(auVar149._8_4_ < auVar148._8_4_);
            auVar60._4_4_ = auVar60._8_4_;
            auVar60._0_4_ = auVar60._8_4_;
            auVar60._12_4_ = auVar60._8_4_;
            auVar110 = blendvps(auVar148,auVar149,auVar60);
            auVar121 = blendvps(auVar149,auVar148,auVar60);
            auVar61._8_4_ = -(uint)(auVar121._8_4_ < auVar154._8_4_);
            auVar61._4_4_ = auVar61._8_4_;
            auVar61._0_4_ = auVar61._8_4_;
            auVar61._12_4_ = auVar61._8_4_;
            SVar123 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar154,auVar121,auVar61);
            SVar150 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar121,auVar154,auVar61);
            *pSVar35 = SVar112;
            pSVar35[1] = SVar150;
            pSVar35[2] = SVar123;
            uVar30 = auVar110._0_8_;
            pSVar35 = pSVar35 + 3;
          }
        }
      }
    }
    if (((uint)uVar30 & 0xf) == 8) {
      pGVar12 = (local_1248->super_Precalculations).grid;
      fVar211 = *(float *)(ray + k * 4 + 0x70) * (float)(*(int *)(pGVar12 + 8) - 1);
      auVar92 = roundss(auVar167,ZEXT416((uint)fVar211),9);
      fVar50 = (float)(*(int *)(pGVar12 + 8) - 1) + -1.0;
      if (fVar50 <= auVar92._0_4_) {
        auVar92._0_4_ = fVar50;
      }
      fVar50 = 0.0;
      if (0.0 <= auVar92._0_4_) {
        fVar50 = auVar92._0_4_;
      }
      uVar26 = (ulong)*(uint *)(pGVar12 + 0xc);
      lVar37 = (long)(int)fVar50 * (ulong)*(uint *)(pGVar12 + 0x28) +
               (ulong)*(uint *)(pGVar12 + 0x24);
      uVar30 = uVar30 >> 4;
      lVar24 = uVar30 * 4 + lVar37;
      pGVar6 = pGVar12 + uVar30 * 4 + lVar37 + 0x2c;
      fVar152 = *(float *)(pGVar6 + 4);
      pGVar31 = pGVar12 + uVar26 * 4 + lVar24 + 0x2c;
      fVar52 = *(float *)(pGVar31 + 4);
      fVar83 = *(float *)(pGVar6 + 8);
      fVar85 = *(float *)(pGVar31 + 8);
      if (uVar26 == 2) {
        fVar83 = fVar152;
        fVar85 = fVar52;
      }
      uVar33 = (ulong)*(uint *)(pGVar12 + 0x14);
      lVar25 = uVar33 * 4 + lVar24;
      pGVar42 = pGVar12 + lVar25 + 0x2c;
      fVar87 = *(float *)(pGVar12 + lVar25 + 0x30);
      pGVar1 = pGVar42 + uVar26 * 4;
      fVar107 = *(float *)(pGVar1 + 4);
      fVar117 = *(float *)(pGVar12 + lVar25 + 0x34);
      fVar138 = *(float *)(pGVar1 + 8);
      if (uVar26 == 2) {
        fVar117 = fVar87;
        fVar138 = fVar107;
      }
      lVar25 = uVar33 * 8 + lVar24;
      pGVar39 = pGVar12 + lVar25 + 0x2c;
      fVar143 = *(float *)(pGVar12 + lVar25 + 0x30);
      pGVar2 = pGVar39 + uVar26 * 4;
      fVar144 = *(float *)(pGVar2 + 4);
      fVar145 = *(float *)(pGVar2 + 8);
      fVar151 = *(float *)(pGVar12 + lVar25 + 0x34);
      if (uVar26 == 2) {
        fVar145 = fVar144;
        fVar151 = fVar143;
      }
      lVar37 = uVar30 * 4 + lVar37 + 0x2c;
      uVar30 = (ulong)(*(uint *)(pGVar12 + 0x28) & 0xfffffffc);
      pGVar3 = pGVar12 + uVar30 + lVar37;
      fVar120 = *(float *)(pGVar3 + 4);
      pGVar4 = pGVar12 + uVar26 * 4 + uVar30 + lVar37;
      fVar157 = *(float *)(pGVar4 + 4);
      fVar135 = *(float *)(pGVar3 + 8);
      fVar158 = *(float *)(pGVar4 + 8);
      if (uVar26 == 2) {
        fVar135 = fVar120;
        fVar158 = fVar157;
      }
      pGVar43 = pGVar42 + uVar30;
      fVar136 = *(float *)(pGVar43 + 4);
      pGVar41 = pGVar43 + uVar26 * 4;
      fVar159 = *(float *)(pGVar41 + 4);
      fVar137 = *(float *)(pGVar43 + 8);
      fVar187 = *(float *)(pGVar41 + 8);
      if (uVar26 == 2) {
        fVar137 = fVar136;
        fVar187 = fVar159;
      }
      fVar211 = fVar211 - fVar50;
      pGVar40 = pGVar39 + uVar30;
      fVar50 = *(float *)(pGVar40 + 4);
      pGVar36 = pGVar40 + uVar26 * 4;
      fVar192 = *(float *)(pGVar36 + 4);
      fVar165 = *(float *)(pGVar40 + 8);
      fVar195 = *(float *)(pGVar36 + 8);
      if (uVar26 == 2) {
        fVar165 = fVar50;
        fVar195 = fVar192;
      }
      uVar28 = *(uint *)(pGVar12 + 0x10);
      local_1240 = pGVar12 + uVar33 * 0xc + lVar24 + 0x2c;
      fVar203 = 1.0 - fVar211;
      fVar178 = *(float *)(ray + k * 4);
      fVar174 = *(float *)(ray + k * 4 + 0x10);
      fVar193 = *(float *)(ray + k * 4 + 0x20);
      fVar8 = *(float *)(ray + k * 4 + 0x40);
      fVar88 = (*(float *)pGVar6 * fVar203 + *(float *)pGVar3 * fVar211) - fVar178;
      fVar105 = (*(float *)pGVar31 * fVar203 + *(float *)pGVar4 * fVar211) - fVar178;
      fStack_1220 = (fVar152 * fVar203 + fVar120 * fVar211) - fVar178;
      fStack_121c = (fVar52 * fVar203 + fVar157 * fVar211) - fVar178;
      fVar179 = (*(float *)pGVar42 * fVar203 + *(float *)pGVar43 * fVar211) - fVar174;
      fVar184 = (*(float *)pGVar1 * fVar203 + *(float *)pGVar41 * fVar211) - fVar174;
      fVar185 = (fVar87 * fVar203 + fVar136 * fVar211) - fVar174;
      fVar186 = (fVar107 * fVar203 + fVar159 * fVar211) - fVar174;
      fVar51 = (*(float *)pGVar39 * fVar203 + *(float *)pGVar40 * fVar211) - fVar193;
      fVar82 = (*(float *)pGVar2 * fVar203 + *(float *)pGVar36 * fVar211) - fVar193;
      fVar84 = (fVar143 * fVar203 + fVar50 * fVar211) - fVar193;
      fVar86 = (fVar144 * fVar203 + fVar192 * fVar211) - fVar193;
      fVar194 = (fVar152 * fVar203 + fVar120 * fVar211) - fVar178;
      fVar197 = (fVar152 * fVar203 + fVar120 * fVar211) - fVar178;
      fVar199 = (fVar83 * fVar203 + fVar135 * fVar211) - fVar178;
      fVar201 = (fVar83 * fVar203 + fVar135 * fVar211) - fVar178;
      fVar120 = (fVar87 * fVar203 + fVar136 * fVar211) - fVar174;
      fVar135 = (fVar87 * fVar203 + fVar136 * fVar211) - fVar174;
      fVar136 = (fVar117 * fVar203 + fVar137 * fVar211) - fVar174;
      fVar137 = (fVar117 * fVar203 + fVar137 * fVar211) - fVar174;
      fVar160 = (fVar143 * fVar203 + fVar50 * fVar211) - fVar193;
      fVar163 = (fVar143 * fVar203 + fVar50 * fVar211) - fVar193;
      fVar164 = (fVar151 * fVar203 + fVar165 * fVar211) - fVar193;
      fVar165 = (fVar151 * fVar203 + fVar165 * fVar211) - fVar193;
      fVar175 = (*(float *)pGVar31 * fVar203 + *(float *)pGVar4 * fVar211) - fVar178;
      fVar176 = (fVar52 * fVar203 + fVar157 * fVar211) - fVar178;
      fVar177 = (fVar52 * fVar203 + fVar157 * fVar211) - fVar178;
      fVar178 = (fVar85 * fVar203 + fVar158 * fVar211) - fVar178;
      fVar171 = (*(float *)pGVar1 * fVar203 + *(float *)pGVar41 * fVar211) - fVar174;
      fVar172 = (fVar107 * fVar203 + fVar159 * fVar211) - fVar174;
      fVar173 = (fVar107 * fVar203 + fVar159 * fVar211) - fVar174;
      fVar174 = (fVar138 * fVar203 + fVar187 * fVar211) - fVar174;
      fVar187 = (*(float *)pGVar2 * fVar203 + *(float *)pGVar36 * fVar211) - fVar193;
      fVar191 = (fVar144 * fVar203 + fVar192 * fVar211) - fVar193;
      fVar192 = (fVar144 * fVar203 + fVar192 * fVar211) - fVar193;
      fVar193 = (fVar145 * fVar203 + fVar195 * fVar211) - fVar193;
      local_10b8 = fVar175 - fVar88;
      fStack_10b4 = fVar176 - fVar105;
      fStack_10b0 = fVar177 - fStack_1220;
      fStack_10ac = fVar178 - fStack_121c;
      local_10d8 = fVar171 - fVar179;
      fStack_10d4 = fVar172 - fVar184;
      fStack_10d0 = fVar173 - fVar185;
      fStack_10cc = fVar174 - fVar186;
      local_10c8._0_4_ = fVar187 - fVar51;
      local_10c8._4_4_ = fVar191 - fVar82;
      fStack_10c0 = fVar192 - fVar84;
      fStack_10bc = fVar193 - fVar86;
      fVar50 = *(float *)(ray + k * 4 + 0x50);
      fVar152 = *(float *)(ray + k * 4 + 0x60);
      fVar151 = fVar88 - fVar194;
      fVar157 = fVar105 - fVar197;
      fVar158 = fStack_1220 - fVar199;
      fVar159 = fStack_121c - fVar201;
      fVar204 = (local_10d8 * (fVar187 + fVar51) - (fVar171 + fVar179) * (float)local_10c8._0_4_) *
                fVar8 + ((fVar175 + fVar88) * (float)local_10c8._0_4_ -
                        (fVar187 + fVar51) * local_10b8) * fVar50 +
                        (local_10b8 * (fVar171 + fVar179) - (fVar175 + fVar88) * local_10d8) *
                        fVar152;
      fVar210 = (fStack_10d4 * (fVar191 + fVar82) - (fVar172 + fVar184) * (float)local_10c8._4_4_) *
                fVar8 + ((fVar176 + fVar105) * (float)local_10c8._4_4_ -
                        (fVar191 + fVar82) * fStack_10b4) * fVar50 +
                        (fStack_10b4 * (fVar172 + fVar184) - (fVar176 + fVar105) * fStack_10d4) *
                        fVar152;
      auVar205._0_8_ = CONCAT44(fVar210,fVar204);
      auVar205._8_4_ =
           (fStack_10d0 * (fVar192 + fVar84) - (fVar173 + fVar185) * fStack_10c0) * fVar8 +
           ((fVar177 + fStack_1220) * fStack_10c0 - (fVar192 + fVar84) * fStack_10b0) * fVar50 +
           (fStack_10b0 * (fVar173 + fVar185) - (fVar177 + fStack_1220) * fStack_10d0) * fVar152;
      auVar205._12_4_ =
           (fStack_10cc * (fVar193 + fVar86) - (fVar174 + fVar186) * fStack_10bc) * fVar8 +
           ((fVar178 + fStack_121c) * fStack_10bc - (fVar193 + fVar86) * fStack_10ac) * fVar50 +
           (fStack_10ac * (fVar174 + fVar186) - (fVar178 + fStack_121c) * fStack_10cc) * fVar152;
      fVar195 = fVar179 - fVar120;
      fVar198 = fVar184 - fVar135;
      fVar200 = fVar185 - fVar136;
      fVar202 = fVar186 - fVar137;
      fVar107 = fVar51 - fVar160;
      fVar117 = fVar82 - fVar163;
      fStack_10e0 = fVar84 - fVar164;
      fStack_10dc = fVar86 - fVar165;
      local_10e8 = (GridSOA *)CONCAT44(fVar117,fVar107);
      auVar180._0_4_ =
           (fVar195 * (fVar51 + fVar160) - (fVar179 + fVar120) * fVar107) * fVar8 +
           ((fVar88 + fVar194) * fVar107 - (fVar51 + fVar160) * fVar151) * fVar50 +
           (fVar151 * (fVar179 + fVar120) - (fVar88 + fVar194) * fVar195) * fVar152;
      auVar180._4_4_ =
           (fVar198 * (fVar82 + fVar163) - (fVar184 + fVar135) * fVar117) * fVar8 +
           ((fVar105 + fVar197) * fVar117 - (fVar82 + fVar163) * fVar157) * fVar50 +
           (fVar157 * (fVar184 + fVar135) - (fVar105 + fVar197) * fVar198) * fVar152;
      auVar180._8_4_ =
           (fVar200 * (fVar84 + fVar164) - (fVar185 + fVar136) * fStack_10e0) * fVar8 +
           ((fStack_1220 + fVar199) * fStack_10e0 - (fVar84 + fVar164) * fVar158) * fVar50 +
           (fVar158 * (fVar185 + fVar136) - (fStack_1220 + fVar199) * fVar200) * fVar152;
      auVar180._12_4_ =
           (fVar202 * (fVar86 + fVar165) - (fVar186 + fVar137) * fStack_10dc) * fVar8 +
           ((fStack_121c + fVar201) * fStack_10dc - (fVar86 + fVar165) * fVar159) * fVar50 +
           (fVar159 * (fVar186 + fVar137) - (fStack_121c + fVar201) * fVar202) * fVar152;
      fVar138 = fVar194 - fVar175;
      fVar143 = fVar197 - fVar176;
      fVar144 = fVar199 - fVar177;
      fVar145 = fVar201 - fVar178;
      fVar52 = fVar120 - fVar171;
      fVar83 = fVar135 - fVar172;
      fVar85 = fVar136 - fVar173;
      fVar87 = fVar137 - fVar174;
      fVar212 = fVar160 - fVar187;
      fVar214 = fVar163 - fVar191;
      fVar216 = fVar164 - fVar192;
      fVar218 = fVar165 - fVar193;
      auVar93._0_4_ =
           (fVar52 * (fVar187 + fVar160) - (fVar171 + fVar120) * fVar212) * fVar8 +
           ((fVar175 + fVar194) * fVar212 - (fVar187 + fVar160) * fVar138) * fVar50 +
           (fVar138 * (fVar171 + fVar120) - (fVar175 + fVar194) * fVar52) * fVar152;
      auVar93._4_4_ =
           (fVar83 * (fVar191 + fVar163) - (fVar172 + fVar135) * fVar214) * fVar8 +
           ((fVar176 + fVar197) * fVar214 - (fVar191 + fVar163) * fVar143) * fVar50 +
           (fVar143 * (fVar172 + fVar135) - (fVar176 + fVar197) * fVar83) * fVar152;
      auVar93._8_4_ =
           (fVar85 * (fVar192 + fVar164) - (fVar173 + fVar136) * fVar216) * fVar8 +
           ((fVar177 + fVar199) * fVar216 - (fVar192 + fVar164) * fVar144) * fVar50 +
           (fVar144 * (fVar173 + fVar136) - (fVar177 + fVar199) * fVar85) * fVar152;
      auVar93._12_4_ =
           (fVar87 * (fVar193 + fVar165) - (fVar174 + fVar137) * fVar218) * fVar8 +
           ((fVar178 + fVar201) * fVar218 - (fVar193 + fVar165) * fVar145) * fVar50 +
           (fVar145 * (fVar174 + fVar137) - (fVar178 + fVar201) * fVar87) * fVar152;
      local_10f8._0_4_ = fVar204 + auVar180._0_4_ + auVar93._0_4_;
      local_10f8._4_4_ = fVar210 + auVar180._4_4_ + auVar93._4_4_;
      fStack_10f0 = auVar205._8_4_ + auVar180._8_4_ + auVar93._8_4_;
      fStack_10ec = auVar205._12_4_ + auVar180._12_4_ + auVar93._12_4_;
      auVar62._8_4_ = auVar205._8_4_;
      auVar62._0_8_ = auVar205._0_8_;
      auVar62._12_4_ = auVar205._12_4_;
      auVar92 = minps(auVar62,auVar180);
      auVar92 = minps(auVar92,auVar93);
      auVar166._8_4_ = auVar205._8_4_;
      auVar166._0_8_ = auVar205._0_8_;
      auVar166._12_4_ = auVar205._12_4_;
      auVar167 = maxps(auVar166,auVar180);
      auVar167 = maxps(auVar167,auVar93);
      local_fa8 = ABS((float)local_10f8._0_4_);
      fStack_fa4 = ABS((float)local_10f8._4_4_);
      fStack_fa0 = ABS(fStack_10f0);
      fStack_f9c = ABS(fStack_10ec);
      auVar168._4_4_ = -(uint)(auVar167._4_4_ <= fStack_fa4 * 1.1920929e-07);
      auVar168._0_4_ = -(uint)(auVar167._0_4_ <= local_fa8 * 1.1920929e-07);
      auVar168._8_4_ = -(uint)(auVar167._8_4_ <= fStack_fa0 * 1.1920929e-07);
      auVar168._12_4_ = -(uint)(auVar167._12_4_ <= fStack_f9c * 1.1920929e-07);
      auVar63._4_4_ = -(uint)(-(fStack_fa4 * 1.1920929e-07) <= auVar92._4_4_);
      auVar63._0_4_ = -(uint)(-(local_fa8 * 1.1920929e-07) <= auVar92._0_4_);
      auVar63._8_4_ = -(uint)(-(fStack_fa0 * 1.1920929e-07) <= auVar92._8_4_);
      auVar63._12_4_ = -(uint)(-(fStack_f9c * 1.1920929e-07) <= auVar92._12_4_);
      auVar168 = auVar168 | auVar63;
      iVar29 = movmskps((int)local_1240,auVar168);
      if (iVar29 != 0) {
        local_f98 = fVar52;
        fStack_f94 = fVar83;
        fStack_f90 = fVar85;
        fStack_f8c = fVar87;
        local_f88 = auVar180;
        auVar206._0_4_ = local_10d8 * fVar107 - fVar195 * (float)local_10c8._0_4_;
        auVar206._4_4_ = fStack_10d4 * fVar117 - fVar198 * (float)local_10c8._4_4_;
        auVar206._8_4_ = fStack_10d0 * fStack_10e0 - fVar200 * fStack_10c0;
        auVar206._12_4_ = fStack_10cc * fStack_10dc - fVar202 * fStack_10bc;
        auVar196._0_4_ = fVar195 * fVar212 - fVar52 * fVar107;
        auVar196._4_4_ = fVar198 * fVar214 - fVar83 * fVar117;
        auVar196._8_4_ = fVar200 * fVar216 - fVar85 * fStack_10e0;
        auVar196._12_4_ = fVar202 * fVar218 - fVar87 * fStack_10dc;
        auVar64._4_4_ = -(uint)(ABS(fVar198 * (float)local_10c8._4_4_) < ABS(fVar83 * fVar117));
        auVar64._0_4_ = -(uint)(ABS(fVar195 * (float)local_10c8._0_4_) < ABS(fVar52 * fVar107));
        auVar64._8_4_ = -(uint)(ABS(fVar200 * fStack_10c0) < ABS(fVar85 * fStack_10e0));
        auVar64._12_4_ = -(uint)(ABS(fVar202 * fStack_10bc) < ABS(fVar87 * fStack_10dc));
        local_1128 = blendvps(auVar196,auVar206,auVar64);
        auVar188._0_4_ = (float)local_10c8._0_4_ * fVar151 - local_10b8 * fVar107;
        auVar188._4_4_ = (float)local_10c8._4_4_ * fVar157 - fStack_10b4 * fVar117;
        auVar188._8_4_ = fStack_10c0 * fVar158 - fStack_10b0 * fStack_10e0;
        auVar188._12_4_ = fStack_10bc * fVar159 - fStack_10ac * fStack_10dc;
        auVar141._0_4_ = fVar138 * fVar107 - fVar151 * fVar212;
        auVar141._4_4_ = fVar143 * fVar117 - fVar157 * fVar214;
        auVar141._8_4_ = fVar144 * fStack_10e0 - fVar158 * fVar216;
        auVar141._12_4_ = fVar145 * fStack_10dc - fVar159 * fVar218;
        auVar65._4_4_ = -(uint)(ABS(fStack_10b4 * fVar117) < ABS(fVar157 * fVar214));
        auVar65._0_4_ = -(uint)(ABS(local_10b8 * fVar107) < ABS(fVar151 * fVar212));
        auVar65._8_4_ = -(uint)(ABS(fStack_10b0 * fStack_10e0) < ABS(fVar158 * fVar216));
        auVar65._12_4_ = -(uint)(ABS(fStack_10ac * fStack_10dc) < ABS(fVar159 * fVar218));
        local_1118 = blendvps(auVar141,auVar188,auVar65);
        auVar161._0_4_ = fVar151 * fVar52 - fVar138 * fVar195;
        auVar161._4_4_ = fVar157 * fVar83 - fVar143 * fVar198;
        auVar161._8_4_ = fVar158 * fVar85 - fVar144 * fVar200;
        auVar161._12_4_ = fVar159 * fVar87 - fVar145 * fVar202;
        auVar66._4_4_ = -(uint)(ABS(fVar157 * fStack_10d4) < ABS(fVar143 * fVar198));
        auVar66._0_4_ = -(uint)(ABS(fVar151 * local_10d8) < ABS(fVar138 * fVar195));
        auVar66._8_4_ = -(uint)(ABS(fVar158 * fStack_10d0) < ABS(fVar144 * fVar200));
        auVar66._12_4_ = -(uint)(ABS(fVar159 * fStack_10cc) < ABS(fVar145 * fVar202));
        auVar18._4_4_ = fStack_10b4 * fVar198 - fVar157 * fStack_10d4;
        auVar18._0_4_ = local_10b8 * fVar195 - fVar151 * local_10d8;
        auVar18._8_4_ = fStack_10b0 * fVar200 - fVar158 * fStack_10d0;
        auVar18._12_4_ = fStack_10ac * fVar202 - fVar159 * fStack_10cc;
        local_1108 = blendvps(auVar161,auVar18,auVar66);
        fVar52 = fVar8 * local_1128._0_4_ + fVar50 * local_1118._0_4_ + fVar152 * local_1108._0_4_;
        fVar83 = fVar8 * local_1128._4_4_ + fVar50 * local_1118._4_4_ + fVar152 * local_1108._4_4_;
        fVar85 = fVar8 * local_1128._8_4_ + fVar50 * local_1118._8_4_ + fVar152 * local_1108._8_4_;
        fVar50 = fVar8 * local_1128._12_4_ +
                 fVar50 * local_1118._12_4_ + fVar152 * local_1108._12_4_;
        auVar124._0_4_ = fVar52 + fVar52;
        auVar124._4_4_ = fVar83 + fVar83;
        auVar124._8_4_ = fVar85 + fVar85;
        auVar124._12_4_ = fVar50 + fVar50;
        auVar67._0_4_ = fVar179 * local_1118._0_4_ + fVar51 * local_1108._0_4_;
        auVar67._4_4_ = fVar184 * local_1118._4_4_ + fVar82 * local_1108._4_4_;
        auVar67._8_4_ = fVar185 * local_1118._8_4_ + fVar84 * local_1108._8_4_;
        auVar67._12_4_ = fVar186 * local_1118._12_4_ + fVar86 * local_1108._12_4_;
        fVar85 = fVar88 * local_1128._0_4_ + auVar67._0_4_;
        fVar87 = fVar105 * local_1128._4_4_ + auVar67._4_4_;
        fVar107 = fStack_1220 * local_1128._8_4_ + auVar67._8_4_;
        fVar117 = fStack_121c * local_1128._12_4_ + auVar67._12_4_;
        auVar92 = rcpps(auVar67,auVar124);
        fVar50 = auVar92._0_4_;
        fVar152 = auVar92._4_4_;
        fVar52 = auVar92._8_4_;
        fVar83 = auVar92._12_4_;
        fVar85 = ((1.0 - auVar124._0_4_ * fVar50) * fVar50 + fVar50) * (fVar85 + fVar85);
        fVar87 = ((1.0 - auVar124._4_4_ * fVar152) * fVar152 + fVar152) * (fVar87 + fVar87);
        fVar52 = ((1.0 - auVar124._8_4_ * fVar52) * fVar52 + fVar52) * (fVar107 + fVar107);
        fVar83 = ((1.0 - auVar124._12_4_ * fVar83) * fVar83 + fVar83) * (fVar117 + fVar117);
        fVar50 = *(float *)(ray + k * 4 + 0x80);
        fVar152 = *(float *)(ray + k * 4 + 0x30);
        auVar68._0_4_ = -(uint)(fVar85 <= fVar50 && fVar152 <= fVar85) & auVar168._0_4_;
        auVar68._4_4_ = -(uint)(fVar87 <= fVar50 && fVar152 <= fVar87) & auVar168._4_4_;
        auVar68._8_4_ = -(uint)(fVar52 <= fVar50 && fVar152 <= fVar52) & auVar168._8_4_;
        auVar68._12_4_ = -(uint)(fVar83 <= fVar50 && fVar152 <= fVar83) & auVar168._12_4_;
        iVar29 = movmskps(iVar29,auVar68);
        if (iVar29 != 0) {
          auVar125._4_4_ = -(uint)(auVar124._4_4_ != 0.0);
          auVar125._0_4_ = -(uint)(auVar124._0_4_ != 0.0);
          auVar125._8_4_ = -(uint)(auVar124._8_4_ != 0.0);
          auVar125._12_4_ = -(uint)(auVar124._12_4_ != 0.0);
          valid.field_0.i[0] = auVar68._0_4_ & -(uint)(auVar124._0_4_ != 0.0);
          valid.field_0.i[1] = auVar68._4_4_ & -(uint)(auVar124._4_4_ != 0.0);
          valid.field_0.i[2] = auVar68._8_4_ & -(uint)(auVar124._8_4_ != 0.0);
          valid.field_0.i[3] = auVar68._12_4_ & -(uint)(auVar124._12_4_ != 0.0);
          iVar29 = movmskps(iVar29,(undefined1  [16])valid.field_0);
          if (iVar29 != 0) {
            uStack_12c0._0_4_ = *(uint *)(pGVar12 + 0x18);
            uStack_12d0._0_4_ = *(undefined4 *)(pGVar12 + 0x1c);
            uStack_12e0 = auVar205._8_8_;
            tNear.field_0._8_8_ = uStack_12e0;
            tNear.field_0._0_8_ = auVar205._0_8_;
            local_1138._4_4_ = fVar87;
            local_1138._0_4_ = fVar85;
            fStack_1130 = fVar52;
            fStack_112c = fVar83;
            pGVar44 = (context->scene->geometries).items[(uint)uStack_12c0].ptr;
            if ((pGVar44->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar92 = *(undefined1 (*) [16])local_1240;
              auVar108 = auVar92._0_12_;
              auVar167 = *(undefined1 (*) [16])(local_1240 + uVar26 * 4);
              auVar90 = auVar167._0_12_;
              if (uVar26 == 2) {
                auVar108._0_8_ = auVar92._0_8_;
                auVar108._8_4_ = auVar92._4_4_;
                auVar90._0_8_ = auVar167._0_8_;
                auVar90._8_4_ = auVar167._4_4_;
              }
              auVar92 = rcpps(auVar125,_local_10f8);
              fVar152 = auVar92._0_4_;
              fVar107 = auVar92._4_4_;
              fVar117 = auVar92._8_4_;
              fVar138 = auVar92._12_4_;
              fVar152 = (float)(-(uint)(1e-18 <= local_fa8) &
                               (uint)(((float)DAT_01f46a60 - (float)local_10f8._0_4_ * fVar152) *
                                      fVar152 + fVar152));
              fVar107 = (float)(-(uint)(1e-18 <= fStack_fa4) &
                               (uint)((DAT_01f46a60._4_4_ - (float)local_10f8._4_4_ * fVar107) *
                                      fVar107 + fVar107));
              fVar117 = (float)(-(uint)(1e-18 <= fStack_fa0) &
                               (uint)((DAT_01f46a60._8_4_ - fStack_10f0 * fVar117) * fVar117 +
                                     fVar117));
              fVar138 = (float)(-(uint)(1e-18 <= fStack_f9c) &
                               (uint)((DAT_01f46a60._12_4_ - fStack_10ec * fVar138) * fVar138 +
                                     fVar138));
              auVar189._0_4_ = fVar204 * fVar152;
              auVar189._4_4_ = fVar210 * fVar107;
              auVar189._8_4_ = auVar205._8_4_ * fVar117;
              auVar189._12_4_ = auVar205._12_4_ * fVar138;
              auVar148 = minps(auVar189,_DAT_01f46a60);
              auVar181._0_4_ = auVar180._0_4_ * fVar152;
              auVar181._4_4_ = auVar180._4_4_ * fVar107;
              auVar181._8_4_ = auVar180._8_4_ * fVar117;
              auVar181._12_4_ = auVar180._12_4_ * fVar138;
              auVar121 = minps(auVar181,_DAT_01f46a60);
              auVar113._4_4_ = auVar108._4_4_;
              auVar127._0_8_ = auVar108._0_8_;
              auVar113._8_4_ = auVar108._8_4_;
              auVar127._8_4_ = auVar113._4_4_;
              uVar106 = auVar90._4_4_;
              auVar127._12_4_ = uVar106;
              uVar89 = auVar90._0_4_;
              auVar126._8_8_ = auVar127._8_8_;
              auVar126._0_4_ = auVar108._0_4_;
              auVar126._4_4_ = uVar89;
              auVar113._0_4_ = auVar113._4_4_;
              auVar113._12_4_ = auVar113._8_4_;
              auVar94._0_8_ = auVar90._0_8_;
              auVar94._8_4_ = uVar106;
              auVar94._12_4_ = auVar90._8_4_;
              auVar110 = pblendw(auVar126,ZEXT816(0),0xaa);
              auVar167 = pblendw(auVar113,ZEXT816(0),0xaa);
              auVar92 = pblendw(auVar94,ZEXT816(0),0xaa);
              fVar120 = auVar148._0_4_;
              fVar157 = auVar148._4_4_;
              fVar135 = auVar148._8_4_;
              fVar158 = auVar148._12_4_;
              fVar143 = auVar121._0_4_;
              fVar144 = auVar121._4_4_;
              fVar145 = auVar121._8_4_;
              fVar151 = auVar121._12_4_;
              fVar152 = ((float)DAT_01f46a60 - fVar120) - fVar143;
              fVar107 = (DAT_01f46a60._4_4_ - fVar157) - fVar144;
              fVar117 = (DAT_01f46a60._8_4_ - fVar135) - fVar145;
              fVar138 = (DAT_01f46a60._12_4_ - fVar158) - fVar151;
              local_1158[0] =
                   (float)auVar110._0_4_ * 0.00012207031 * fVar152 +
                   (float)auVar92._0_4_ * 0.00012207031 * fVar143 +
                   (float)auVar167._0_4_ * 0.00012207031 * fVar120;
              local_1158[1] =
                   (float)auVar110._4_4_ * 0.00012207031 * fVar107 +
                   (float)auVar92._4_4_ * 0.00012207031 * fVar144 +
                   (float)auVar167._4_4_ * 0.00012207031 * fVar157;
              local_1158[2] =
                   (float)auVar110._8_4_ * 0.00012207031 * fVar117 +
                   (float)auVar92._8_4_ * 0.00012207031 * fVar145 +
                   (float)auVar167._8_4_ * 0.00012207031 * fVar135;
              local_1158[3] =
                   (float)auVar110._12_4_ * 0.00012207031 * fVar138 +
                   (float)auVar92._12_4_ * 0.00012207031 * fVar151 +
                   (float)auVar167._12_4_ * 0.00012207031 * fVar158;
              local_1148[0] =
                   fVar152 * (float)(auVar126._0_4_ >> 0x10) * 0.00012207031 +
                   (float)(uVar89 >> 0x10) * 0.00012207031 * fVar143 +
                   (float)(auVar113._4_4_ >> 0x10) * 0.00012207031 * fVar120;
              local_1148[1] =
                   fVar107 * (float)(uVar89 >> 0x10) * 0.00012207031 +
                   (float)(uVar106 >> 0x10) * 0.00012207031 * fVar144 +
                   (float)(auVar113._4_4_ >> 0x10) * 0.00012207031 * fVar157;
              local_1148[2] =
                   fVar117 * (float)(auVar113._4_4_ >> 0x10) * 0.00012207031 +
                   (float)(uVar106 >> 0x10) * 0.00012207031 * fVar145 +
                   (float)(auVar113._8_4_ >> 0x10) * 0.00012207031 * fVar135;
              local_1148[3] =
                   fVar138 * (float)(uVar106 >> 0x10) * 0.00012207031 +
                   (float)(auVar90._8_4_ >> 0x10) * 0.00012207031 * fVar151 +
                   (float)(auVar113._8_4_ >> 0x10) * 0.00012207031 * fVar158;
              auVar20._4_4_ = fVar87;
              auVar20._0_4_ = fVar85;
              auVar20._8_4_ = fVar52;
              auVar20._12_4_ = fVar83;
              auVar167 = blendvps(_DAT_01f45a30,auVar20,(undefined1  [16])valid.field_0);
              auVar128._4_4_ = auVar167._0_4_;
              auVar128._0_4_ = auVar167._4_4_;
              auVar128._8_4_ = auVar167._12_4_;
              auVar128._12_4_ = auVar167._8_4_;
              auVar92 = minps(auVar128,auVar167);
              auVar95._0_8_ = auVar92._8_8_;
              auVar95._8_4_ = auVar92._0_4_;
              auVar95._12_4_ = auVar92._4_4_;
              auVar92 = minps(auVar95,auVar92);
              uVar46 = -(uint)(auVar92._0_4_ == auVar167._0_4_);
              uVar47 = -(uint)(auVar92._4_4_ == auVar167._4_4_);
              uVar48 = -(uint)(auVar92._8_4_ == auVar167._8_4_);
              uVar49 = -(uint)(auVar92._12_4_ == auVar167._12_4_);
              auVar114._0_4_ = uVar46 & valid.field_0.i[0];
              auVar114._4_4_ = uVar47 & valid.field_0.i[1];
              auVar114._8_4_ = uVar48 & valid.field_0.i[2];
              auVar114._12_4_ = uVar49 & valid.field_0.i[3];
              iVar29 = movmskps((int)local_1240,auVar114);
              uVar89 = 0xffffffff;
              uVar106 = 0xffffffff;
              uVar118 = 0xffffffff;
              uVar119 = 0xffffffff;
              if (iVar29 != 0) {
                uVar89 = uVar46;
                uVar106 = uVar47;
                uVar118 = uVar48;
                uVar119 = uVar49;
              }
              auVar69._0_4_ = valid.field_0.i[0] & uVar89;
              auVar69._4_4_ = valid.field_0.i[1] & uVar106;
              auVar69._8_4_ = valid.field_0.i[2] & uVar118;
              auVar69._12_4_ = valid.field_0.i[3] & uVar119;
              uVar32 = movmskps(iVar29,auVar69);
              uVar30 = CONCAT44((int)((ulong)local_1240 >> 0x20),uVar32);
              lVar37 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar44->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar50 = local_1158[lVar37];
                fVar152 = local_1148[lVar37];
                uVar32 = *(undefined4 *)(local_1128 + lVar37 * 4);
                uVar9 = *(undefined4 *)(local_1118 + lVar37 * 4);
                uVar10 = *(undefined4 *)(local_1108 + lVar37 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1138 + lVar37 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = uVar32;
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                *(float *)(ray + k * 4 + 0xf0) = fVar50;
                *(float *)(ray + k * 4 + 0x100) = fVar152;
                *(undefined4 *)(ray + k * 4 + 0x110) = (undefined4)uStack_12d0;
                *(uint *)(ray + k * 4 + 0x120) = (uint)uStack_12c0;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_12c8 = CONCAT44((uint)uStack_12c0,(uint)uStack_12c0);
                uStack_12c0._4_4_ = (uint)uStack_12c0;
                local_12d8 = CONCAT44((undefined4)uStack_12d0,(undefined4)uStack_12d0);
                uStack_12d0._4_4_ = (undefined4)uStack_12d0;
                auVar92 = *(undefined1 (*) [16])
                           (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                local_1238 = uVar26;
                local_1230 = (ulong)uVar28;
                local_1228 = pGVar44;
                while( true ) {
                  local_1078 = local_1158[lVar37];
                  fVar152 = local_1148[lVar37];
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1138 + lVar37 * 4);
                  args.context = context->user;
                  local_1068._4_4_ = fVar152;
                  local_1068._0_4_ = fVar152;
                  local_1068._8_4_ = fVar152;
                  local_1068._12_4_ = fVar152;
                  local_10a8 = *(undefined4 *)(local_1128 + lVar37 * 4);
                  uVar32 = *(undefined4 *)(local_1118 + lVar37 * 4);
                  uVar9 = *(undefined4 *)(local_1108 + lVar37 * 4);
                  local_1098._4_4_ = uVar32;
                  local_1098._0_4_ = uVar32;
                  local_1098._8_4_ = uVar32;
                  local_1098._12_4_ = uVar32;
                  local_1088._4_4_ = uVar9;
                  local_1088._0_4_ = uVar9;
                  local_1088._8_4_ = uVar9;
                  local_1088._12_4_ = uVar9;
                  uStack_10a4 = local_10a8;
                  uStack_10a0 = local_10a8;
                  uStack_109c = local_10a8;
                  fStack_1074 = local_1078;
                  fStack_1070 = local_1078;
                  fStack_106c = local_1078;
                  local_1058 = local_12d8;
                  uStack_1050 = uStack_12d0;
                  local_1048 = local_12c8;
                  uStack_1040 = uStack_12c0;
                  local_1038 = (args.context)->instID[0];
                  uStack_1034 = local_1038;
                  uStack_1030 = local_1038;
                  uStack_102c = local_1038;
                  local_1028 = (args.context)->instPrimID[0];
                  uStack_1024 = local_1028;
                  uStack_1020 = local_1028;
                  uStack_101c = local_1028;
                  args.valid = (int *)local_1258;
                  args.geometryUserPtr = pGVar44->userPtr;
                  args.hit = (RTCHitN *)&local_10a8;
                  args.N = 4;
                  pRVar27 = (RTCRayN *)pGVar44->intersectionFilterN;
                  local_1258 = auVar92;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar27 != (RTCRayN *)0x0) {
                    pRVar27 = (RTCRayN *)(*(code *)pRVar27)(&args);
                    pGVar44 = local_1228;
                  }
                  if (local_1258 == (undefined1  [16])0x0) {
                    auVar99._8_4_ = 0xffffffff;
                    auVar99._0_8_ = 0xffffffffffffffff;
                    auVar99._12_4_ = 0xffffffff;
                    auVar99 = auVar99 ^ _DAT_01f46b70;
                  }
                  else {
                    pRVar27 = (RTCRayN *)context->args->filter;
                    if ((pRVar27 != (RTCRayN *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar44->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar27 = (RTCRayN *)(*(code *)pRVar27)(&args);
                      pGVar44 = local_1228;
                    }
                    auVar78._0_4_ = -(uint)(local_1258._0_4_ == 0);
                    auVar78._4_4_ = -(uint)(local_1258._4_4_ == 0);
                    auVar78._8_4_ = -(uint)(local_1258._8_4_ == 0);
                    auVar78._12_4_ = -(uint)(local_1258._12_4_ == 0);
                    auVar99 = auVar78 ^ _DAT_01f46b70;
                    if (local_1258 != (undefined1  [16])0x0) {
                      auVar167 = blendvps(*(undefined1 (*) [16])args.hit,
                                          *(undefined1 (*) [16])(args.ray + 0xc0),auVar78);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar167;
                      auVar167 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                          *(undefined1 (*) [16])(args.ray + 0xd0),auVar78);
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar167;
                      auVar167 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                          *(undefined1 (*) [16])(args.ray + 0xe0),auVar78);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar167;
                      auVar167 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                          *(undefined1 (*) [16])(args.ray + 0xf0),auVar78);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar167;
                      auVar167 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                          *(undefined1 (*) [16])(args.ray + 0x100),auVar78);
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar167;
                      auVar167 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                          *(undefined1 (*) [16])(args.ray + 0x110),auVar78);
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar167;
                      auVar167 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                          *(undefined1 (*) [16])(args.ray + 0x120),auVar78);
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar167;
                      auVar167 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                          *(undefined1 (*) [16])(args.ray + 0x130),auVar78);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar167;
                      auVar167 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                          *(undefined1 (*) [16])(args.ray + 0x140),auVar78);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar167;
                      pRVar27 = args.ray;
                    }
                  }
                  if ((_DAT_01f46b40 & auVar99) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar50;
                  }
                  else {
                    fVar50 = *(float *)(ray + k * 4 + 0x80);
                  }
                  *(undefined4 *)(local_1258 + lVar37 * 4 + -0x10) = 0;
                  valid.field_0.i[0] = -(uint)(fVar85 <= fVar50) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(fVar87 <= fVar50) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(fVar52 <= fVar50) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(fVar83 <= fVar50) & valid.field_0.i[3];
                  iVar29 = movmskps((int)pRVar27,(undefined1  [16])valid.field_0);
                  if (iVar29 == 0) break;
                  auVar22._4_4_ = fVar87;
                  auVar22._0_4_ = fVar85;
                  auVar22._8_4_ = fVar52;
                  auVar22._12_4_ = fVar83;
                  auVar110 = blendvps(_DAT_01f45a30,auVar22,(undefined1  [16])valid.field_0);
                  auVar133._4_4_ = auVar110._0_4_;
                  auVar133._0_4_ = auVar110._4_4_;
                  auVar133._8_4_ = auVar110._12_4_;
                  auVar133._12_4_ = auVar110._8_4_;
                  auVar167 = minps(auVar133,auVar110);
                  auVar100._0_8_ = auVar167._8_8_;
                  auVar100._8_4_ = auVar167._0_4_;
                  auVar100._12_4_ = auVar167._4_4_;
                  auVar167 = minps(auVar100,auVar167);
                  auVar101._0_8_ =
                       CONCAT44(-(uint)(auVar167._4_4_ == auVar110._4_4_) & valid.field_0.i[1],
                                -(uint)(auVar167._0_4_ == auVar110._0_4_) & valid.field_0.i[0]);
                  auVar101._8_4_ = -(uint)(auVar167._8_4_ == auVar110._8_4_) & valid.field_0.i[2];
                  auVar101._12_4_ = -(uint)(auVar167._12_4_ == auVar110._12_4_) & valid.field_0.i[3]
                  ;
                  iVar29 = movmskps(iVar29,auVar101);
                  aVar79 = valid.field_0;
                  if (iVar29 != 0) {
                    aVar79.i[2] = auVar101._8_4_;
                    aVar79._0_8_ = auVar101._0_8_;
                    aVar79.i[3] = auVar101._12_4_;
                  }
                  uVar32 = movmskps(iVar29,(undefined1  [16])aVar79);
                  uVar30 = CONCAT44((int)((ulong)pRVar27 >> 0x20),uVar32);
                  lVar37 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (2 < uVar28) {
        lVar24 = uVar26 * 4 + lVar24;
        pGVar31 = pGVar12 + lVar24 + 0x2c;
        fVar50 = *(float *)(pGVar12 + lVar24 + 0x30);
        pGVar6 = pGVar31 + uVar26 * 4;
        fVar152 = *(float *)(pGVar6 + 4);
        fVar52 = *(float *)(pGVar6 + 8);
        fVar83 = *(float *)(pGVar12 + lVar24 + 0x34);
        if (uVar26 == 2) {
          fVar52 = fVar152;
          fVar83 = fVar50;
        }
        local_10e8 = (local_1248->super_Precalculations).grid;
        uVar30 = (ulong)*(uint *)(local_10e8 + 0x14);
        pGVar12 = pGVar31 + uVar30 * 4;
        fVar85 = *(float *)(pGVar12 + 4);
        pGVar1 = pGVar12 + uVar26 * 4;
        fVar87 = *(float *)(pGVar1 + 4);
        fVar107 = *(float *)(pGVar12 + 8);
        fVar117 = *(float *)(pGVar1 + 8);
        if (uVar26 == 2) {
          fVar107 = fVar85;
          fVar117 = fVar87;
        }
        pGVar42 = pGVar31 + uVar30 * 8;
        fVar138 = *(float *)(pGVar42 + 4);
        pGVar2 = pGVar42 + uVar26 * 4;
        fVar143 = *(float *)(pGVar2 + 4);
        fVar144 = *(float *)(pGVar2 + 8);
        fVar145 = *(float *)(pGVar42 + 8);
        if (uVar26 == 2) {
          fVar144 = fVar143;
          fVar145 = fVar138;
        }
        uVar33 = (ulong)(*(uint *)(local_10e8 + 0x28) & 0xfffffffc);
        pGVar39 = pGVar31 + uVar33;
        fVar151 = *(float *)(pGVar39 + 4);
        pGVar3 = pGVar31 + uVar26 * 4 + uVar33;
        fVar120 = *(float *)(pGVar3 + 4);
        fVar157 = *(float *)(pGVar39 + 8);
        fVar135 = *(float *)(pGVar3 + 8);
        if (uVar26 == 2) {
          fVar157 = fVar151;
          fVar135 = fVar120;
        }
        pGVar41 = pGVar12 + uVar33;
        fVar158 = *(float *)(pGVar41 + 4);
        pGVar4 = pGVar41 + uVar26 * 4;
        fVar136 = *(float *)(pGVar4 + 4);
        fVar159 = *(float *)(pGVar41 + 8);
        fVar137 = *(float *)(pGVar4 + 8);
        if (uVar26 == 2) {
          fVar159 = fVar158;
          fVar137 = fVar136;
        }
        pGVar36 = pGVar42 + uVar33;
        fVar187 = *(float *)(pGVar36 + 4);
        pGVar43 = pGVar36 + uVar26 * 4;
        fVar192 = *(float *)(pGVar43 + 4);
        fVar165 = *(float *)(pGVar36 + 8);
        fVar195 = *(float *)(pGVar43 + 8);
        if (uVar26 == 2) {
          fVar165 = fVar187;
          fVar195 = fVar192;
        }
        local_1240 = pGVar31 + uVar30 * 0xc;
        local_12d8._0_4_ = (float)*(undefined8 *)pGVar3;
        local_12d8._4_4_ = (float)((ulong)*(undefined8 *)pGVar3 >> 0x20);
        local_12c8._0_4_ = (float)*(undefined8 *)pGVar6;
        local_12c8._4_4_ = (float)((ulong)*(undefined8 *)pGVar6 >> 0x20);
        fVar178 = *(float *)(ray + k * 4);
        fVar174 = *(float *)(ray + k * 4 + 0x10);
        fVar193 = *(float *)(ray + k * 4 + 0x20);
        fVar8 = *(float *)(ray + k * 4 + 0x40);
        fVar51 = *(float *)(ray + k * 4 + 0x50);
        fVar82 = (*(float *)pGVar31 * fVar203 + *(float *)pGVar39 * fVar211) - fVar178;
        fVar84 = (*(float *)pGVar6 * fVar203 + *(float *)pGVar3 * fVar211) - fVar178;
        fVar86 = (fVar50 * fVar203 + fVar151 * fVar211) - fVar178;
        fVar88 = (fVar152 * fVar203 + fVar120 * fVar211) - fVar178;
        fVar213 = (*(float *)pGVar12 * fVar203 + *(float *)pGVar41 * fVar211) - fVar174;
        fVar215 = (*(float *)pGVar1 * fVar203 + *(float *)pGVar4 * fVar211) - fVar174;
        fVar217 = (fVar85 * fVar203 + fVar158 * fVar211) - fVar174;
        fVar219 = (fVar87 * fVar203 + fVar136 * fVar211) - fVar174;
        fVar212 = (*(float *)pGVar42 * fVar203 + *(float *)pGVar36 * fVar211) - fVar193;
        fVar214 = (*(float *)pGVar2 * fVar203 + *(float *)pGVar43 * fVar211) - fVar193;
        fVar216 = (fVar138 * fVar203 + fVar187 * fVar211) - fVar193;
        fVar218 = (fVar143 * fVar203 + fVar192 * fVar211) - fVar193;
        fVar198 = (fVar50 * fVar203 + fVar151 * fVar211) - fVar178;
        fVar200 = (fVar50 * fVar203 + fVar151 * fVar211) - fVar178;
        fVar202 = (fVar83 * fVar203 + fVar157 * fVar211) - fVar178;
        fVar204 = (fVar83 * fVar203 + fVar157 * fVar211) - fVar178;
        fVar177 = (fVar85 * fVar203 + fVar158 * fVar211) - fVar174;
        fVar179 = (fVar85 * fVar203 + fVar158 * fVar211) - fVar174;
        fVar184 = (fVar107 * fVar203 + fVar159 * fVar211) - fVar174;
        fVar185 = (fVar107 * fVar203 + fVar159 * fVar211) - fVar174;
        fVar159 = (fVar138 * fVar203 + fVar187 * fVar211) - fVar193;
        fVar187 = (fVar138 * fVar203 + fVar187 * fVar211) - fVar193;
        fVar105 = (fVar145 * fVar203 + fVar165 * fVar211) - fVar193;
        fVar160 = (fVar145 * fVar203 + fVar165 * fVar211) - fVar193;
        fVar145 = ((float)local_12c8 * fVar203 + (float)local_12d8 * fVar211) - fVar178;
        fVar151 = (local_12c8._4_4_ * fVar203 + local_12d8._4_4_ * fVar211) - fVar178;
        fVar120 = (fVar152 * fVar203 + fVar120 * fVar211) - fVar178;
        fVar178 = (fVar52 * fVar203 + fVar135 * fVar211) - fVar178;
        fVar152 = (*(float *)pGVar1 * fVar203 + *(float *)pGVar4 * fVar211) - fVar174;
        fVar83 = (fVar87 * fVar203 + fVar136 * fVar211) - fVar174;
        fVar107 = (fVar87 * fVar203 + fVar136 * fVar211) - fVar174;
        fVar174 = (fVar117 * fVar203 + fVar137 * fVar211) - fVar174;
        fVar163 = (*(float *)pGVar2 * fVar203 + *(float *)pGVar43 * fVar211) - fVar193;
        fVar171 = (fVar143 * fVar203 + fVar192 * fVar211) - fVar193;
        fVar173 = (fVar143 * fVar203 + fVar192 * fVar211) - fVar193;
        fVar193 = (fVar144 * fVar203 + fVar195 * fVar211) - fVar193;
        fVar186 = fVar145 - fVar82;
        fVar191 = fVar151 - fVar84;
        fVar194 = fVar120 - fVar86;
        fVar197 = fVar178 - fVar88;
        fVar211 = fVar152 - fVar213;
        fVar85 = fVar83 - fVar215;
        fVar117 = fVar107 - fVar217;
        fVar138 = fVar174 - fVar219;
        fVar164 = fVar163 - fVar212;
        fVar172 = fVar171 - fVar214;
        fVar175 = fVar173 - fVar216;
        fVar176 = fVar193 - fVar218;
        fVar50 = *(float *)(ray + k * 4 + 0x60);
        local_10b8 = fVar82 - fVar198;
        fStack_10b4 = fVar84 - fVar200;
        fStack_10b0 = fVar86 - fVar202;
        fStack_10ac = fVar88 - fVar204;
        fVar137 = fVar213 - fVar177;
        fVar192 = fVar215 - fVar179;
        fVar165 = fVar217 - fVar184;
        fVar195 = fVar219 - fVar185;
        fVar158 = (fVar211 * (fVar163 + fVar212) - (fVar152 + fVar213) * fVar164) * fVar8 +
                  ((fVar145 + fVar82) * fVar164 - (fVar163 + fVar212) * fVar186) * fVar51 +
                  (fVar186 * (fVar152 + fVar213) - (fVar145 + fVar82) * fVar211) * fVar50;
        fVar136 = (fVar85 * (fVar171 + fVar214) - (fVar83 + fVar215) * fVar172) * fVar8 +
                  ((fVar151 + fVar84) * fVar172 - (fVar171 + fVar214) * fVar191) * fVar51 +
                  (fVar191 * (fVar83 + fVar215) - (fVar151 + fVar84) * fVar85) * fVar50;
        auVar155._0_8_ = CONCAT44(fVar136,fVar158);
        auVar155._8_4_ =
             (fVar117 * (fVar173 + fVar216) - (fVar107 + fVar217) * fVar175) * fVar8 +
             ((fVar120 + fVar86) * fVar175 - (fVar173 + fVar216) * fVar194) * fVar51 +
             (fVar194 * (fVar107 + fVar217) - (fVar120 + fVar86) * fVar117) * fVar50;
        auVar155._12_4_ =
             (fVar138 * (fVar193 + fVar218) - (fVar174 + fVar219) * fVar176) * fVar8 +
             ((fVar178 + fVar88) * fVar176 - (fVar193 + fVar218) * fVar197) * fVar51 +
             (fVar197 * (fVar174 + fVar219) - (fVar178 + fVar88) * fVar138) * fVar50;
        fVar52 = fVar212 - fVar159;
        fVar87 = fVar214 - fVar187;
        fStack_1220 = fVar216 - fVar105;
        fStack_121c = fVar218 - fVar160;
        local_1228 = (Geometry *)CONCAT44(fVar87,fVar52);
        auVar207._0_4_ =
             (fVar137 * (fVar212 + fVar159) - (fVar213 + fVar177) * fVar52) * fVar8 +
             ((fVar82 + fVar198) * fVar52 - (fVar212 + fVar159) * local_10b8) * fVar51 +
             (local_10b8 * (fVar213 + fVar177) - (fVar82 + fVar198) * fVar137) * fVar50;
        auVar207._4_4_ =
             (fVar192 * (fVar214 + fVar187) - (fVar215 + fVar179) * fVar87) * fVar8 +
             ((fVar84 + fVar200) * fVar87 - (fVar214 + fVar187) * fStack_10b4) * fVar51 +
             (fStack_10b4 * (fVar215 + fVar179) - (fVar84 + fVar200) * fVar192) * fVar50;
        auVar207._8_4_ =
             (fVar165 * (fVar216 + fVar105) - (fVar217 + fVar184) * fStack_1220) * fVar8 +
             ((fVar86 + fVar202) * fStack_1220 - (fVar216 + fVar105) * fStack_10b0) * fVar51 +
             (fStack_10b0 * (fVar217 + fVar184) - (fVar86 + fVar202) * fVar165) * fVar50;
        auVar207._12_4_ =
             (fVar195 * (fVar218 + fVar160) - (fVar219 + fVar185) * fStack_121c) * fVar8 +
             ((fVar88 + fVar204) * fStack_121c - (fVar218 + fVar160) * fStack_10ac) * fVar51 +
             (fStack_10ac * (fVar219 + fVar185) - (fVar88 + fVar204) * fVar195) * fVar50;
        fVar143 = fVar198 - fVar145;
        fVar144 = fVar200 - fVar151;
        fVar157 = fVar202 - fVar120;
        fVar135 = fVar204 - fVar178;
        fVar199 = fVar177 - fVar152;
        fVar201 = fVar179 - fVar83;
        fVar203 = fVar184 - fVar107;
        fVar210 = fVar185 - fVar174;
        local_10d8 = fVar159 - fVar163;
        fStack_10d4 = fVar187 - fVar171;
        fStack_10d0 = fVar105 - fVar173;
        fStack_10cc = fVar160 - fVar193;
        auVar96._0_4_ =
             (fVar199 * (fVar163 + fVar159) - (fVar152 + fVar177) * local_10d8) * fVar8 +
             ((fVar145 + fVar198) * local_10d8 - (fVar163 + fVar159) * fVar143) * fVar51 +
             (fVar143 * (fVar152 + fVar177) - (fVar145 + fVar198) * fVar199) * fVar50;
        auVar96._4_4_ =
             (fVar201 * (fVar171 + fVar187) - (fVar83 + fVar179) * fStack_10d4) * fVar8 +
             ((fVar151 + fVar200) * fStack_10d4 - (fVar171 + fVar187) * fVar144) * fVar51 +
             (fVar144 * (fVar83 + fVar179) - (fVar151 + fVar200) * fVar201) * fVar50;
        auVar96._8_4_ =
             (fVar203 * (fVar173 + fVar105) - (fVar107 + fVar184) * fStack_10d0) * fVar8 +
             ((fVar120 + fVar202) * fStack_10d0 - (fVar173 + fVar105) * fVar157) * fVar51 +
             (fVar157 * (fVar107 + fVar184) - (fVar120 + fVar202) * fVar203) * fVar50;
        auVar96._12_4_ =
             (fVar210 * (fVar193 + fVar160) - (fVar174 + fVar185) * fStack_10cc) * fVar8 +
             ((fVar178 + fVar204) * fStack_10cc - (fVar193 + fVar160) * fVar135) * fVar51 +
             (fVar135 * (fVar174 + fVar185) - (fVar178 + fVar204) * fVar210) * fVar50;
        local_10c8._0_4_ = fVar158 + auVar207._0_4_ + auVar96._0_4_;
        local_10c8._4_4_ = fVar136 + auVar207._4_4_ + auVar96._4_4_;
        fStack_10c0 = auVar155._8_4_ + auVar207._8_4_ + auVar96._8_4_;
        fStack_10bc = auVar155._12_4_ + auVar207._12_4_ + auVar96._12_4_;
        auVar70._8_4_ = auVar155._8_4_;
        auVar70._0_8_ = auVar155._0_8_;
        auVar70._12_4_ = auVar155._12_4_;
        auVar92 = minps(auVar70,auVar207);
        auVar167 = minps(auVar92,auVar96);
        auVar169._8_4_ = auVar155._8_4_;
        auVar169._0_8_ = auVar155._0_8_;
        auVar169._12_4_ = auVar155._12_4_;
        auVar92 = maxps(auVar169,auVar207);
        auVar110 = maxps(auVar92,auVar96);
        fStack_10f0 = ABS(fStack_10c0);
        fStack_10ec = ABS(fStack_10bc);
        uVar30 = CONCAT44(local_10c8._4_4_,local_10c8._0_4_);
        local_10f8 = (undefined1  [8])(uVar30 & 0x7fffffff7fffffff);
        auVar92 = _local_10f8;
        auVar170._4_4_ = -(uint)(auVar110._4_4_ <= ABS((float)local_10c8._4_4_) * 1.1920929e-07);
        auVar170._0_4_ = -(uint)(auVar110._0_4_ <= ABS((float)local_10c8._0_4_) * 1.1920929e-07);
        auVar170._8_4_ = -(uint)(auVar110._8_4_ <= fStack_10f0 * 1.1920929e-07);
        auVar170._12_4_ = -(uint)(auVar110._12_4_ <= fStack_10ec * 1.1920929e-07);
        auVar71._4_4_ = -(uint)(-(ABS((float)local_10c8._4_4_) * 1.1920929e-07) <= auVar167._4_4_);
        auVar71._0_4_ = -(uint)(-(ABS((float)local_10c8._0_4_) * 1.1920929e-07) <= auVar167._0_4_);
        auVar71._8_4_ = -(uint)(-(fStack_10f0 * 1.1920929e-07) <= auVar167._8_4_);
        auVar71._12_4_ = -(uint)(-(fStack_10ec * 1.1920929e-07) <= auVar167._12_4_);
        auVar170 = auVar170 | auVar71;
        iVar29 = movmskps((int)local_1240,auVar170);
        if (iVar29 != 0) {
          auVar162._0_4_ = fVar137 * local_10d8 - fVar199 * fVar52;
          auVar162._4_4_ = fVar192 * fStack_10d4 - fVar201 * fVar87;
          auVar162._8_4_ = fVar165 * fStack_10d0 - fVar203 * fStack_1220;
          auVar162._12_4_ = fVar195 * fStack_10cc - fVar210 * fStack_121c;
          auVar72._4_4_ = -(uint)(ABS(fVar192 * fVar172) < ABS(fVar201 * fVar87));
          auVar72._0_4_ = -(uint)(ABS(fVar137 * fVar164) < ABS(fVar199 * fVar52));
          auVar72._8_4_ = -(uint)(ABS(fVar165 * fVar175) < ABS(fVar203 * fStack_1220));
          auVar72._12_4_ = -(uint)(ABS(fVar195 * fVar176) < ABS(fVar210 * fStack_121c));
          auVar21._4_4_ = fVar85 * fVar87 - fVar192 * fVar172;
          auVar21._0_4_ = fVar211 * fVar52 - fVar137 * fVar164;
          auVar21._8_4_ = fVar117 * fStack_1220 - fVar165 * fVar175;
          auVar21._12_4_ = fVar138 * fStack_121c - fVar195 * fVar176;
          local_1128 = blendvps(auVar162,auVar21,auVar72);
          auVar182._0_4_ = fVar164 * local_10b8 - fVar186 * fVar52;
          auVar182._4_4_ = fVar172 * fStack_10b4 - fVar191 * fVar87;
          auVar182._8_4_ = fVar175 * fStack_10b0 - fVar194 * fStack_1220;
          auVar182._12_4_ = fVar176 * fStack_10ac - fVar197 * fStack_121c;
          auVar142._0_4_ = fVar143 * fVar52 - local_10b8 * local_10d8;
          auVar142._4_4_ = fVar144 * fVar87 - fStack_10b4 * fStack_10d4;
          auVar142._8_4_ = fVar157 * fStack_1220 - fStack_10b0 * fStack_10d0;
          auVar142._12_4_ = fVar135 * fStack_121c - fStack_10ac * fStack_10cc;
          auVar73._4_4_ = -(uint)(ABS(fVar191 * fVar87) < ABS(fStack_10b4 * fStack_10d4));
          auVar73._0_4_ = -(uint)(ABS(fVar186 * fVar52) < ABS(local_10b8 * local_10d8));
          auVar73._8_4_ = -(uint)(ABS(fVar194 * fStack_1220) < ABS(fStack_10b0 * fStack_10d0));
          auVar73._12_4_ = -(uint)(ABS(fVar197 * fStack_121c) < ABS(fStack_10ac * fStack_10cc));
          local_1118 = blendvps(auVar142,auVar182,auVar73);
          auVar156._0_4_ = fVar186 * fVar137 - local_10b8 * fVar211;
          auVar156._4_4_ = fVar191 * fVar192 - fStack_10b4 * fVar85;
          auVar156._8_4_ = fVar194 * fVar165 - fStack_10b0 * fVar117;
          auVar156._12_4_ = fVar197 * fVar195 - fStack_10ac * fVar138;
          auVar208._0_4_ = local_10b8 * fVar199 - fVar143 * fVar137;
          auVar208._4_4_ = fStack_10b4 * fVar201 - fVar144 * fVar192;
          auVar208._8_4_ = fStack_10b0 * fVar203 - fVar157 * fVar165;
          auVar208._12_4_ = fStack_10ac * fVar210 - fVar135 * fVar195;
          auVar74._4_4_ = -(uint)(ABS(fStack_10b4 * fVar85) < ABS(fVar144 * fVar192));
          auVar74._0_4_ = -(uint)(ABS(local_10b8 * fVar211) < ABS(fVar143 * fVar137));
          auVar74._8_4_ = -(uint)(ABS(fStack_10b0 * fVar117) < ABS(fVar157 * fVar165));
          auVar74._12_4_ = -(uint)(ABS(fStack_10ac * fVar138) < ABS(fVar135 * fVar195));
          local_1108 = blendvps(auVar208,auVar156,auVar74);
          fVar83 = fVar8 * local_1128._0_4_ + fVar51 * local_1118._0_4_ + fVar50 * local_1108._0_4_;
          fVar85 = fVar8 * local_1128._4_4_ + fVar51 * local_1118._4_4_ + fVar50 * local_1108._4_4_;
          fVar87 = fVar8 * local_1128._8_4_ + fVar51 * local_1118._8_4_ + fVar50 * local_1108._8_4_;
          fVar107 = fVar8 * local_1128._12_4_ +
                    fVar51 * local_1118._12_4_ + fVar50 * local_1108._12_4_;
          fVar83 = fVar83 + fVar83;
          fVar85 = fVar85 + fVar85;
          fVar87 = fVar87 + fVar87;
          fVar107 = fVar107 + fVar107;
          auVar75._0_4_ = fVar213 * local_1118._0_4_ + fVar212 * local_1108._0_4_;
          auVar75._4_4_ = fVar215 * local_1118._4_4_ + fVar214 * local_1108._4_4_;
          auVar75._8_4_ = fVar217 * local_1118._8_4_ + fVar216 * local_1108._8_4_;
          auVar75._12_4_ = fVar219 * local_1118._12_4_ + fVar218 * local_1108._12_4_;
          fVar50 = fVar82 * local_1128._0_4_ + auVar75._0_4_;
          fVar211 = fVar84 * local_1128._4_4_ + auVar75._4_4_;
          fVar152 = fVar86 * local_1128._8_4_ + auVar75._8_4_;
          fVar52 = fVar88 * local_1128._12_4_ + auVar75._12_4_;
          auVar129._0_4_ = fVar50 + fVar50;
          auVar129._4_4_ = fVar211 + fVar211;
          auVar129._8_4_ = fVar152 + fVar152;
          auVar129._12_4_ = fVar52 + fVar52;
          auVar19._4_4_ = fVar85;
          auVar19._0_4_ = fVar83;
          auVar19._8_4_ = fVar87;
          auVar19._12_4_ = fVar107;
          auVar167 = rcpps(auVar75,auVar19);
          fVar50 = auVar167._0_4_;
          fVar211 = auVar167._4_4_;
          fVar152 = auVar167._8_4_;
          fVar52 = auVar167._12_4_;
          auVar183._0_4_ = ((1.0 - fVar83 * fVar50) * fVar50 + fVar50) * auVar129._0_4_;
          auVar183._4_4_ = ((1.0 - fVar85 * fVar211) * fVar211 + fVar211) * auVar129._4_4_;
          auVar183._8_4_ = ((1.0 - fVar87 * fVar152) * fVar152 + fVar152) * auVar129._8_4_;
          auVar183._12_4_ = ((1.0 - fVar107 * fVar52) * fVar52 + fVar52) * auVar129._12_4_;
          fVar211 = *(float *)(ray + k * 4 + 0x80);
          fVar50 = *(float *)(ray + k * 4 + 0x30);
          auVar76._0_4_ =
               -(uint)(auVar183._0_4_ <= fVar211 && fVar50 <= auVar183._0_4_) & auVar170._0_4_;
          auVar76._4_4_ =
               -(uint)(auVar183._4_4_ <= fVar211 && fVar50 <= auVar183._4_4_) & auVar170._4_4_;
          auVar76._8_4_ =
               -(uint)(auVar183._8_4_ <= fVar211 && fVar50 <= auVar183._8_4_) & auVar170._8_4_;
          auVar76._12_4_ =
               -(uint)(auVar183._12_4_ <= fVar211 && fVar50 <= auVar183._12_4_) & auVar170._12_4_;
          iVar29 = movmskps(iVar29,auVar76);
          if (iVar29 != 0) {
            valid.field_0.i[0] = auVar76._0_4_ & -(uint)(fVar83 != 0.0);
            valid.field_0.i[1] = auVar76._4_4_ & -(uint)(fVar85 != 0.0);
            valid.field_0.i[2] = auVar76._8_4_ & -(uint)(fVar87 != 0.0);
            valid.field_0.i[3] = auVar76._12_4_ & -(uint)(fVar107 != 0.0);
            iVar29 = movmskps(iVar29,(undefined1  [16])valid.field_0);
            if (iVar29 != 0) {
              uStack_12e0._0_4_ = *(uint *)(local_10e8 + 0x18);
              uStack_12c0._0_4_ = *(uint *)(local_10e8 + 0x1c);
              uStack_12f0 = auVar155._8_8_;
              tNear.field_0._8_8_ = uStack_12f0;
              tNear.field_0._0_8_ = auVar155._0_8_;
              _local_1138 = auVar183;
              pGVar44 = (context->scene->geometries).items[(uint)uStack_12e0].ptr;
              if ((pGVar44->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar167 = *(undefined1 (*) [16])local_1240;
                auVar109 = auVar167._0_12_;
                auVar110 = *(undefined1 (*) [16])(local_1240 + uVar26 * 4);
                auVar91 = auVar110._0_12_;
                if (uVar26 == 2) {
                  auVar109._0_8_ = auVar167._0_8_;
                  auVar109._8_4_ = auVar167._4_4_;
                  auVar91._0_8_ = auVar110._0_8_;
                  auVar91._8_4_ = auVar110._4_4_;
                }
                auVar167 = rcpps(auVar129,_local_10c8);
                fVar50 = auVar167._0_4_;
                fVar152 = auVar167._4_4_;
                fVar52 = auVar167._8_4_;
                fVar83 = auVar167._12_4_;
                fVar50 = (float)(-(uint)(1e-18 <= (float)local_10f8._0_4_) &
                                (uint)(((float)DAT_01f46a60 - (float)local_10c8._0_4_ * fVar50) *
                                       fVar50 + fVar50));
                fVar152 = (float)(-(uint)(1e-18 <= (float)local_10f8._4_4_) &
                                 (uint)((DAT_01f46a60._4_4_ - (float)local_10c8._4_4_ * fVar152) *
                                        fVar152 + fVar152));
                fVar52 = (float)(-(uint)(1e-18 <= fStack_10f0) &
                                (uint)((DAT_01f46a60._8_4_ - fStack_10c0 * fVar52) * fVar52 + fVar52
                                      ));
                fVar83 = (float)(-(uint)(1e-18 <= fStack_10ec) &
                                (uint)((DAT_01f46a60._12_4_ - fStack_10bc * fVar83) * fVar83 +
                                      fVar83));
                auVar190._0_4_ = fVar158 * fVar50;
                auVar190._4_4_ = fVar136 * fVar152;
                auVar190._8_4_ = auVar155._8_4_ * fVar52;
                auVar190._12_4_ = auVar155._12_4_ * fVar83;
                auVar148 = minps(auVar190,_DAT_01f46a60);
                auVar209._0_4_ = auVar207._0_4_ * fVar50;
                auVar209._4_4_ = auVar207._4_4_ * fVar152;
                auVar209._8_4_ = auVar207._8_4_ * fVar52;
                auVar209._12_4_ = auVar207._12_4_ * fVar83;
                auVar149 = minps(auVar209,_DAT_01f46a60);
                auVar115._4_4_ = auVar109._4_4_;
                auVar131._0_8_ = auVar109._0_8_;
                auVar115._8_4_ = auVar109._8_4_;
                auVar131._8_4_ = auVar115._4_4_;
                uVar106 = auVar91._4_4_;
                auVar131._12_4_ = uVar106;
                uVar89 = auVar91._0_4_;
                auVar130._8_8_ = auVar131._8_8_;
                auVar130._0_4_ = auVar109._0_4_;
                auVar130._4_4_ = uVar89;
                auVar115._0_4_ = auVar115._4_4_;
                auVar115._12_4_ = auVar115._8_4_;
                auVar97._0_8_ = auVar91._0_8_;
                auVar97._8_4_ = uVar106;
                auVar97._12_4_ = auVar91._8_4_;
                auVar121 = pblendw(auVar130,ZEXT816(0),0xaa);
                auVar110 = pblendw(auVar115,ZEXT816(0),0xaa);
                auVar167 = pblendw(auVar97,ZEXT816(0),0xaa);
                fVar85 = auVar148._0_4_;
                fVar87 = auVar148._4_4_;
                fVar107 = auVar148._8_4_;
                fVar117 = auVar148._12_4_;
                fVar138 = auVar149._0_4_;
                fVar143 = auVar149._4_4_;
                fVar144 = auVar149._8_4_;
                fVar145 = auVar149._12_4_;
                fVar50 = ((float)DAT_01f46a60 - fVar85) - fVar138;
                fVar152 = (DAT_01f46a60._4_4_ - fVar87) - fVar143;
                fVar52 = (DAT_01f46a60._8_4_ - fVar107) - fVar144;
                fVar83 = (DAT_01f46a60._12_4_ - fVar117) - fVar145;
                local_1158[0] =
                     (float)auVar121._0_4_ * 0.00012207031 * fVar50 +
                     (float)auVar167._0_4_ * 0.00012207031 * fVar138 +
                     (float)auVar110._0_4_ * 0.00012207031 * fVar85;
                local_1158[1] =
                     (float)auVar121._4_4_ * 0.00012207031 * fVar152 +
                     (float)auVar167._4_4_ * 0.00012207031 * fVar143 +
                     (float)auVar110._4_4_ * 0.00012207031 * fVar87;
                local_1158[2] =
                     (float)auVar121._8_4_ * 0.00012207031 * fVar52 +
                     (float)auVar167._8_4_ * 0.00012207031 * fVar144 +
                     (float)auVar110._8_4_ * 0.00012207031 * fVar107;
                local_1158[3] =
                     (float)auVar121._12_4_ * 0.00012207031 * fVar83 +
                     (float)auVar167._12_4_ * 0.00012207031 * fVar145 +
                     (float)auVar110._12_4_ * 0.00012207031 * fVar117;
                local_1148[0] =
                     fVar50 * (float)(auVar130._0_4_ >> 0x10) * 0.00012207031 +
                     (float)(uVar89 >> 0x10) * 0.00012207031 * fVar138 +
                     (float)(auVar115._4_4_ >> 0x10) * 0.00012207031 * fVar85;
                local_1148[1] =
                     fVar152 * (float)(uVar89 >> 0x10) * 0.00012207031 +
                     (float)(uVar106 >> 0x10) * 0.00012207031 * fVar143 +
                     (float)(auVar115._4_4_ >> 0x10) * 0.00012207031 * fVar87;
                local_1148[2] =
                     fVar52 * (float)(auVar115._4_4_ >> 0x10) * 0.00012207031 +
                     (float)(uVar106 >> 0x10) * 0.00012207031 * fVar144 +
                     (float)(auVar115._8_4_ >> 0x10) * 0.00012207031 * fVar107;
                local_1148[3] =
                     fVar83 * (float)(uVar106 >> 0x10) * 0.00012207031 +
                     (float)(auVar91._8_4_ >> 0x10) * 0.00012207031 * fVar145 +
                     (float)(auVar115._8_4_ >> 0x10) * 0.00012207031 * fVar117;
                auVar110 = blendvps(_DAT_01f45a30,auVar183,(undefined1  [16])valid.field_0);
                auVar132._4_4_ = auVar110._0_4_;
                auVar132._0_4_ = auVar110._4_4_;
                auVar132._8_4_ = auVar110._12_4_;
                auVar132._12_4_ = auVar110._8_4_;
                auVar167 = minps(auVar132,auVar110);
                auVar98._0_8_ = auVar167._8_8_;
                auVar98._8_4_ = auVar167._0_4_;
                auVar98._12_4_ = auVar167._4_4_;
                auVar167 = minps(auVar98,auVar167);
                uVar46 = -(uint)(auVar167._0_4_ == auVar110._0_4_);
                uVar47 = -(uint)(auVar167._4_4_ == auVar110._4_4_);
                uVar48 = -(uint)(auVar167._8_4_ == auVar110._8_4_);
                uVar49 = -(uint)(auVar167._12_4_ == auVar110._12_4_);
                auVar116._0_4_ = uVar46 & valid.field_0.i[0];
                auVar116._4_4_ = uVar47 & valid.field_0.i[1];
                auVar116._8_4_ = uVar48 & valid.field_0.i[2];
                auVar116._12_4_ = uVar49 & valid.field_0.i[3];
                iVar29 = movmskps((int)local_1240,auVar116);
                uVar89 = 0xffffffff;
                uVar106 = 0xffffffff;
                uVar118 = 0xffffffff;
                uVar119 = 0xffffffff;
                if (iVar29 != 0) {
                  uVar89 = uVar46;
                  uVar106 = uVar47;
                  uVar118 = uVar48;
                  uVar119 = uVar49;
                }
                auVar77._0_4_ = valid.field_0.i[0] & uVar89;
                auVar77._4_4_ = valid.field_0.i[1] & uVar106;
                auVar77._8_4_ = valid.field_0.i[2] & uVar118;
                auVar77._12_4_ = valid.field_0.i[3] & uVar119;
                uVar32 = movmskps(iVar29,auVar77);
                uVar30 = CONCAT44((int)((ulong)local_1240 >> 0x20),uVar32);
                lVar37 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar44->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar50 = local_1158[lVar37];
                  fVar211 = local_1148[lVar37];
                  uVar32 = *(undefined4 *)(local_1128 + lVar37 * 4);
                  uVar9 = *(undefined4 *)(local_1118 + lVar37 * 4);
                  uVar10 = *(undefined4 *)(local_1108 + lVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1138 + lVar37 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar32;
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                  *(float *)(ray + k * 4 + 0xf0) = fVar50;
                  *(float *)(ray + k * 4 + 0x100) = fVar211;
                  *(uint *)(ray + k * 4 + 0x110) = (uint)uStack_12c0;
                  *(uint *)(ray + k * 4 + 0x120) = (uint)uStack_12e0;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_12e8 = CONCAT44((uint)uStack_12e0,(uint)uStack_12e0);
                  uStack_12e0._4_4_ = (uint)uStack_12e0;
                  local_12c8 = CONCAT44((uint)uStack_12c0,(uint)uStack_12c0);
                  uStack_12c0._4_4_ = (uint)uStack_12c0;
                  auVar167 = *(undefined1 (*) [16])
                              (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                  local_1238 = uVar26;
                  local_1230 = (ulong)uVar28;
                  _local_10f8 = auVar92;
                  while( true ) {
                    local_1078 = local_1158[lVar37];
                    fVar50 = local_1148[lVar37];
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1138 + lVar37 * 4);
                    args.context = context->user;
                    local_1068._4_4_ = fVar50;
                    local_1068._0_4_ = fVar50;
                    local_1068._8_4_ = fVar50;
                    local_1068._12_4_ = fVar50;
                    local_10a8 = *(undefined4 *)(local_1128 + lVar37 * 4);
                    uVar32 = *(undefined4 *)(local_1118 + lVar37 * 4);
                    uVar9 = *(undefined4 *)(local_1108 + lVar37 * 4);
                    local_1098._4_4_ = uVar32;
                    local_1098._0_4_ = uVar32;
                    local_1098._8_4_ = uVar32;
                    local_1098._12_4_ = uVar32;
                    local_1088._4_4_ = uVar9;
                    local_1088._0_4_ = uVar9;
                    local_1088._8_4_ = uVar9;
                    local_1088._12_4_ = uVar9;
                    uStack_10a4 = local_10a8;
                    uStack_10a0 = local_10a8;
                    uStack_109c = local_10a8;
                    fStack_1074 = local_1078;
                    fStack_1070 = local_1078;
                    fStack_106c = local_1078;
                    local_1058 = local_12c8;
                    uStack_1050 = uStack_12c0;
                    local_1048 = local_12e8;
                    uStack_1040 = uStack_12e0;
                    local_1038 = (args.context)->instID[0];
                    uStack_1034 = local_1038;
                    uStack_1030 = local_1038;
                    uStack_102c = local_1038;
                    local_1028 = (args.context)->instPrimID[0];
                    uStack_1024 = local_1028;
                    uStack_1020 = local_1028;
                    uStack_101c = local_1028;
                    args.valid = (int *)local_1258;
                    args.geometryUserPtr = pGVar44->userPtr;
                    args.hit = (RTCHitN *)&local_10a8;
                    args.N = 4;
                    pRVar27 = (RTCRayN *)pGVar44->intersectionFilterN;
                    local_1258 = auVar167;
                    args.ray = (RTCRayN *)ray;
                    if (pRVar27 != (RTCRayN *)0x0) {
                      pRVar27 = (RTCRayN *)(*(code *)pRVar27)(&args);
                    }
                    if (local_1258 == (undefined1  [16])0x0) {
                      auVar102._8_4_ = 0xffffffff;
                      auVar102._0_8_ = 0xffffffffffffffff;
                      auVar102._12_4_ = 0xffffffff;
                      auVar102 = auVar102 ^ _DAT_01f46b70;
                    }
                    else {
                      pRVar27 = (RTCRayN *)context->args->filter;
                      if ((pRVar27 != (RTCRayN *)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar44->field_8).field_0x2 & 0x40) != 0)))) {
                        pRVar27 = (RTCRayN *)(*(code *)pRVar27)(&args);
                      }
                      auVar80._0_4_ = -(uint)(local_1258._0_4_ == 0);
                      auVar80._4_4_ = -(uint)(local_1258._4_4_ == 0);
                      auVar80._8_4_ = -(uint)(local_1258._8_4_ == 0);
                      auVar80._12_4_ = -(uint)(local_1258._12_4_ == 0);
                      auVar102 = auVar80 ^ _DAT_01f46b70;
                      if (local_1258 != (undefined1  [16])0x0) {
                        auVar92 = blendvps(*(undefined1 (*) [16])args.hit,
                                           *(undefined1 (*) [16])(args.ray + 0xc0),auVar80);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar92;
                        auVar92 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                           *(undefined1 (*) [16])(args.ray + 0xd0),auVar80);
                        *(undefined1 (*) [16])(args.ray + 0xd0) = auVar92;
                        auVar92 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                           *(undefined1 (*) [16])(args.ray + 0xe0),auVar80);
                        *(undefined1 (*) [16])(args.ray + 0xe0) = auVar92;
                        auVar92 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                           *(undefined1 (*) [16])(args.ray + 0xf0),auVar80);
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar92;
                        auVar92 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                           *(undefined1 (*) [16])(args.ray + 0x100),auVar80);
                        *(undefined1 (*) [16])(args.ray + 0x100) = auVar92;
                        auVar92 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                           *(undefined1 (*) [16])(args.ray + 0x110),auVar80);
                        *(undefined1 (*) [16])(args.ray + 0x110) = auVar92;
                        auVar92 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                           *(undefined1 (*) [16])(args.ray + 0x120),auVar80);
                        *(undefined1 (*) [16])(args.ray + 0x120) = auVar92;
                        auVar92 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                           *(undefined1 (*) [16])(args.ray + 0x130),auVar80);
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar92;
                        auVar92 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                           *(undefined1 (*) [16])(args.ray + 0x140),auVar80);
                        *(undefined1 (*) [16])(args.ray + 0x140) = auVar92;
                        pRVar27 = args.ray;
                      }
                    }
                    if ((_DAT_01f46b40 & auVar102) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar211;
                    }
                    else {
                      fVar211 = *(float *)(ray + k * 4 + 0x80);
                    }
                    *(undefined4 *)(local_1258 + lVar37 * 4 + -0x10) = 0;
                    valid.field_0.i[0] = -(uint)(auVar183._0_4_ <= fVar211) & valid.field_0.i[0];
                    valid.field_0.i[1] = -(uint)(auVar183._4_4_ <= fVar211) & valid.field_0.i[1];
                    valid.field_0.i[2] = -(uint)(auVar183._8_4_ <= fVar211) & valid.field_0.i[2];
                    valid.field_0.i[3] = -(uint)(auVar183._12_4_ <= fVar211) & valid.field_0.i[3];
                    iVar29 = movmskps((int)pRVar27,(undefined1  [16])valid.field_0);
                    if (iVar29 == 0) break;
                    auVar110 = blendvps(_DAT_01f45a30,auVar183,(undefined1  [16])valid.field_0);
                    auVar134._4_4_ = auVar110._0_4_;
                    auVar134._0_4_ = auVar110._4_4_;
                    auVar134._8_4_ = auVar110._12_4_;
                    auVar134._12_4_ = auVar110._8_4_;
                    auVar92 = minps(auVar134,auVar110);
                    auVar103._0_8_ = auVar92._8_8_;
                    auVar103._8_4_ = auVar92._0_4_;
                    auVar103._12_4_ = auVar92._4_4_;
                    auVar92 = minps(auVar103,auVar92);
                    auVar104._0_8_ =
                         CONCAT44(-(uint)(auVar92._4_4_ == auVar110._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar92._0_4_ == auVar110._0_4_) & valid.field_0.i[0]);
                    auVar104._8_4_ = -(uint)(auVar92._8_4_ == auVar110._8_4_) & valid.field_0.i[2];
                    auVar104._12_4_ =
                         -(uint)(auVar92._12_4_ == auVar110._12_4_) & valid.field_0.i[3];
                    iVar29 = movmskps(iVar29,auVar104);
                    aVar81 = valid.field_0;
                    if (iVar29 != 0) {
                      aVar81.i[2] = auVar104._8_4_;
                      aVar81._0_8_ = auVar104._0_8_;
                      aVar81.i[3] = auVar104._12_4_;
                    }
                    uVar32 = movmskps(iVar29,(undefined1  [16])aVar81);
                    uVar30 = CONCAT44((int)((ulong)pRVar27 >> 0x20),uVar32);
                    lVar37 = 0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar167._4_4_ = uVar32;
      auVar167._0_4_ = uVar32;
      auVar167._8_4_ = uVar32;
      auVar167._12_4_ = uVar32;
      fVar50 = local_fc8;
      fVar211 = fStack_fc4;
      fVar152 = fStack_fc0;
      fVar52 = fStack_fbc;
      fVar83 = local_fd8;
      fVar85 = fStack_fd4;
      fVar87 = fStack_fd0;
      fVar107 = fStack_fcc;
      auVar92 = local_1018;
      fVar117 = local_fb8;
      fVar138 = fStack_fb4;
      fVar143 = fStack_fb0;
      fVar144 = fStack_fac;
      fVar145 = local_fe8;
      fVar151 = fStack_fe4;
      fVar120 = fStack_fe0;
      fVar157 = fStack_fdc;
      fVar135 = local_ff8;
      fVar158 = fStack_ff4;
      fVar136 = fStack_ff0;
      fVar159 = fStack_fec;
      fVar137 = local_1008;
      fVar187 = fStack_1004;
      fVar192 = fStack_1000;
      fVar165 = fStack_ffc;
    }
    else {
      sVar13 = *(size_t *)*(GridSOA **)(uVar30 & 0xfffffffffffffff0);
      (local_1248->super_Precalculations).grid = *(GridSOA **)(uVar30 & 0xfffffffffffffff0);
      uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar167._4_4_ = uVar32;
      auVar167._0_4_ = uVar32;
      auVar167._8_4_ = uVar32;
      auVar167._12_4_ = uVar32;
      if (sVar13 != 0) {
        (pSVar35->ptr).ptr = sVar13;
        pSVar35->dist = 0;
        pSVar35 = pSVar35 + 1;
      }
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }